

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

string * Catch::fpToString<float>(string *__return_storage_ptr__,float value,int precision)

{
  uint uVar1;
  ReusableStringStream *pRVar2;
  size_type sVar3;
  size_type sVar4;
  reference pvVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  size_type local_50;
  size_t i;
  undefined1 local_40 [8];
  ReusableStringStream rss;
  allocator<char> local_19;
  int local_18;
  float local_14;
  int precision_local;
  float value_local;
  string *d;
  
  local_18 = precision;
  local_14 = value;
  _precision_local = __return_storage_ptr__;
  uVar1 = isnan((double)(ulong)(uint)value);
  if ((uVar1 & 1) == 0) {
    ReusableStringStream::ReusableStringStream((ReusableStringStream *)local_40);
    i._4_4_ = clara::std::setprecision(local_18);
    pRVar2 = ReusableStringStream::operator<<
                       ((ReusableStringStream *)local_40,(_Setprecision *)((long)&i + 4));
    pRVar2 = ReusableStringStream::operator<<(pRVar2,clara::std::fixed);
    ReusableStringStream::operator<<(pRVar2,&local_14);
    i._3_1_ = 0;
    ReusableStringStream::str_abi_cxx11_(__return_storage_ptr__,(ReusableStringStream *)local_40);
    sVar3 = clara::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            find_last_not_of(__return_storage_ptr__,'0',0xffffffffffffffff);
    local_50 = sVar3;
    if ((sVar3 != 0xffffffffffffffff) &&
       (sVar4 = clara::std::__cxx11::
                basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                          (__return_storage_ptr__), sVar3 != sVar4 - 1)) {
      pvVar5 = clara::std::__cxx11::
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator[]
                         (__return_storage_ptr__,local_50);
      if (*pvVar5 == '.') {
        local_50 = local_50 + 1;
      }
      clara::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                (&local_70,__return_storage_ptr__,0,local_50 + 1);
      clara::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      operator=(__return_storage_ptr__,&local_70);
      std::__cxx11::string::~string((string *)&local_70);
    }
    i._3_1_ = 1;
    ReusableStringStream::~ReusableStringStream((ReusableStringStream *)local_40);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"nan",&local_19);
    std::allocator<char>::~allocator((allocator<char> *)&local_19);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string fpToString( T value, int precision ) {
    if (Catch::isnan(value)) {
        return "nan";
    }

    ReusableStringStream rss;
    rss << std::setprecision( precision )
        << std::fixed
        << value;
    std::string d = rss.str();
    std::size_t i = d.find_last_not_of( '0' );
    if( i != std::string::npos && i != d.size()-1 ) {
        if( d[i] == '.' )
            i++;
        d = d.substr( 0, i+1 );
    }
    return d;
}